

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InternalException::InternalException<long,long>
          (InternalException *this,string *msg,long params,long params_1)

{
  long in_R8;
  string local_30;
  
  Exception::ConstructMessage<long,long>(&local_30,(Exception *)msg,(string *)params,params_1,in_R8)
  ;
  InternalException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}